

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.h
# Opt level: O0

void __thiscall
mjs::binary_expression::binary_expression
          (binary_expression *this,source_extend *extend,token_type op,expression_ptr *lhs,
          expression_ptr *rhs)

{
  bool bVar1;
  expression_ptr *rhs_local;
  expression_ptr *lhs_local;
  token_type op_local;
  source_extend *extend_local;
  binary_expression *this_local;
  
  expression::syntax_node(&this->super_expression,extend);
  (this->super_expression).super_syntax_node._vptr_syntax_node =
       (_func_int **)&PTR__binary_expression_00298500;
  this->op_ = op;
  std::unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>::unique_ptr
            (&this->lhs_,lhs);
  std::unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>::unique_ptr
            (&this->rhs_,rhs);
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&this->lhs_);
  if (!bVar1) {
    __assert_fail("lhs_",
                  "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/parser.h",
                  0x184,
                  "mjs::binary_expression::binary_expression(const source_extend &, token_type, expression_ptr &&, expression_ptr &&)"
                 );
  }
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&this->rhs_);
  if (!bVar1) {
    __assert_fail("rhs_",
                  "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/parser.h",
                  0x185,
                  "mjs::binary_expression::binary_expression(const source_extend &, token_type, expression_ptr &&, expression_ptr &&)"
                 );
  }
  return;
}

Assistant:

explicit binary_expression(const source_extend& extend, token_type op, expression_ptr&& lhs, expression_ptr&& rhs) : expression(extend), op_(op), lhs_(std::move(lhs)), rhs_(std::move(rhs)) {
        assert(lhs_);
        assert(rhs_);
    }